

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

amqp_link_t * amqp_create_link_for_frame(amqp_connection_state_t state,amqp_frame_t *frame)

{
  undefined8 uVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  amqp_pool_t *pool;
  amqp_link_t *paVar6;
  undefined8 *puVar7;
  
  pool = amqp_get_or_create_channel_pool(state,frame->channel);
  if (pool != (amqp_pool_t *)0x0) {
    paVar6 = (amqp_link_t *)amqp_pool_alloc(pool,0x10);
    puVar7 = (undefined8 *)amqp_pool_alloc(pool,0x30);
    if (puVar7 != (undefined8 *)0x0 && paVar6 != (amqp_link_t *)0x0) {
      uVar1 = *(undefined8 *)frame;
      sVar2 = (frame->payload).body_fragment.len;
      pvVar3 = (frame->payload).method.decoded;
      pvVar4 = (frame->payload).properties.decoded;
      pvVar5 = (frame->payload).properties.raw.bytes;
      puVar7[4] = (frame->payload).properties.raw.len;
      puVar7[5] = pvVar5;
      puVar7[2] = pvVar3;
      puVar7[3] = pvVar4;
      *puVar7 = uVar1;
      puVar7[1] = sVar2;
      paVar6->data = puVar7;
      return paVar6;
    }
  }
  return (amqp_link_t *)0x0;
}

Assistant:

static amqp_link_t * amqp_create_link_for_frame(amqp_connection_state_t state, amqp_frame_t *frame)
{
  amqp_link_t *link;
  amqp_frame_t *frame_copy;

  amqp_pool_t *channel_pool = amqp_get_or_create_channel_pool(state, frame->channel);

  if (NULL == channel_pool) {
    return NULL;
  }

  link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));
  frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));

  if (NULL == link || NULL == frame_copy) {
    return NULL;
  }

  *frame_copy = *frame;
  link->data = frame_copy;

  return link;
}